

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packed_gamma_file3.hpp
# Opt level: O1

void __thiscall
packed_gamma_file3<unsigned_int,_6UL>::fill_bits(packed_gamma_file3<unsigned_int,_6UL> *this)

{
  uint uVar1;
  bool bVar2;
  uint8_t x;
  byte local_29;
  
  if (((&this->field_0xb0)[*(long *)(*(long *)&this->in + -0x18)] & 2) == 0) {
    do {
      std::istream::read((char *)&this->in,(long)&local_29);
      uVar1 = 7;
      do {
        std::vector<bool,_std::allocator<bool>_>::push_back
                  (&this->bits,(local_29 >> (uVar1 & 0x1f) & 1) != 0);
        bVar2 = uVar1 != 0;
        uVar1 = uVar1 - 1;
      } while (bVar2);
    } while (((&this->field_0xb0)[*(long *)(*(long *)&this->in + -0x18)] & 2) == 0);
  }
  return;
}

Assistant:

void fill_bits(){

		//first of all, delete from bits all bits that have already been read

		assert(idx_in_bits==0);

		while(not in.eof()){

			uint8_t x;
			in.read((char*)&x,1);

			//push back bits of x in vector bits
			for(int j=0;j<8;++j) bits.push_back( (x>>(7-j)) & uint8_t(1) );

		}

	}